

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

bool miniros::urisEqual(string *uri1,string *uri2)

{
  uint32_t port2;
  uint32_t port1;
  string host2;
  string host1;
  uint32_t *in_stack_000000c8;
  string *in_stack_000000d0;
  string *in_stack_000000d8;
  __type_conflict local_71;
  int iVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0);
  iVar2 = 0;
  iVar1 = 0;
  network::splitURI(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  network::splitURI(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  local_71 = false;
  if (iVar2 == iVar1) {
    local_71 = std::operator==(in_stack_ffffffffffffffb0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar2,iVar1));
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return local_71;
}

Assistant:

bool urisEqual(const std::string& uri1, const std::string& uri2)
{
  std::string host1, host2;
  uint32_t port1 = 0, port2 = 0;
  network::splitURI(uri1, host1, port1);
  network::splitURI(uri2, host2, port2);
  return port1 == port2 && host1 == host2;
}